

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

QString * __thiscall
QAccessibleButton::text(QString *__return_storage_ptr__,QAccessibleButton *this,Text t)

{
  qsizetype qVar1;
  bool bVar2;
  QPushButton *this_00;
  QWidget *this_01;
  QAbstractButton *pQVar3;
  char16_t *pcVar4;
  QArrayData *pQVar5;
  long in_FS_OFFSET;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (t == Name) {
    this_01 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
    QWidget::accessibleName(&local_58,this_01);
    pcVar4 = local_58.d.ptr;
    pQVar5 = &(local_58.d.d)->super_QArrayData;
    (__return_storage_ptr__->d).d = local_58.d.d;
    local_58.d.d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
    local_58.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_58.d.size;
    if (local_58.d.size == 0) {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar3 = (QAbstractButton *)QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
      QAbstractButton::text(&local_70,pQVar3);
      qt_accStripAmp(&local_58,&local_70);
      goto LAB_00523046;
    }
  }
  else if (t == Accelerator) {
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    this_00 = (QPushButton *)QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
    if ((this_00 == (QPushButton *)0x0) || (bVar2 = QPushButton::isDefault(this_00), !bVar2)) {
      pQVar5 = (QArrayData *)0x0;
      pcVar4 = (char16_t *)0x0;
    }
    else {
      QKeySequence::QKeySequence((QKeySequence *)&local_70,0x1000005,0,0,0);
      QKeySequence::toString((SequenceFormat)&local_58);
      qVar1 = local_58.d.size;
      pcVar4 = local_58.d.ptr;
      pQVar5 = &(local_58.d.d)->super_QArrayData;
      (__return_storage_ptr__->d).d = local_58.d.d;
      local_58.d.d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = local_58.d.ptr;
      local_58.d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = local_58.d.size;
      local_58.d.size = 0;
      QKeySequence::~QKeySequence((QKeySequence *)&local_70);
      if (qVar1 != 0) goto LAB_005230b8;
    }
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar3 = (QAbstractButton *)QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
    QAbstractButton::text(&local_70,pQVar3);
    qt_accHotKey(&local_58,&local_70);
LAB_00523046:
    (__return_storage_ptr__->d).d = local_58.d.d;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
    (__return_storage_ptr__->d).size = local_58.d.size;
    local_58.d.size = 0;
    local_58.d.d = (Data *)pQVar5;
    local_58.d.ptr = pcVar4;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((__return_storage_ptr__->d).size == 0) {
    QAccessibleWidget::text(&local_58,&this->super_QAccessibleWidget,t);
    pQVar5 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar4 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_58.d.d;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
    (__return_storage_ptr__->d).size = local_58.d.size;
    local_58.d.size = 0;
    local_58.d.d = (Data *)pQVar5;
    local_58.d.ptr = pcVar4;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
LAB_005230b8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QAccessibleButton::text(QAccessible::Text t) const
{
    QString str;
    switch (t) {
    case QAccessible::Accelerator:
    {
#if QT_CONFIG(shortcut) && QT_CONFIG(pushbutton)
        QPushButton *pb = qobject_cast<QPushButton*>(object());
        if (pb && pb->isDefault())
            str = QKeySequence(Qt::Key_Enter).toString(QKeySequence::NativeText);
#endif
        if (str.isEmpty())
            str = qt_accHotKey(button()->text());
    }
         break;
    case QAccessible::Name:
        str = widget()->accessibleName();
        if (str.isEmpty())
            str = qt_accStripAmp(button()->text());
        break;
    default:
        break;
    }
    if (str.isEmpty())
        str = QAccessibleWidget::text(t);
    return str;
}